

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void print_decl(c2m_ctx_t c2m_ctx,FILE *f,decl_t decl)

{
  fwrite(": ",2,1,(FILE *)f);
  if (decl->scope != (node_t_conflict)0x0) {
    fprintf((FILE *)f,"scope node = %u, ",(ulong)decl->scope->uid);
  }
  print_decl_spec(c2m_ctx,f,&decl->decl_spec);
  if ((undefined1  [96])((undefined1  [96])*decl & (undefined1  [96])0x1) != (undefined1  [96])0x0)
  {
    fwrite(", addressable",0xd,1,(FILE *)f);
  }
  if ((undefined1  [96])((undefined1  [96])*decl & (undefined1  [96])0x8) != (undefined1  [96])0x0)
  {
    fwrite(", used",6,1,(FILE *)f);
  }
  if ((undefined1  [96])((undefined1  [96])*decl & (undefined1  [96])0x2) == (undefined1  [96])0x0)
  {
    fprintf((FILE *)f,", offset = %llu",decl->offset);
    if (-1 < decl->bit_offset) {
      fprintf((FILE *)f,", bit offset = %d");
    }
  }
  else {
    fwrite(", reg",5,1,(FILE *)f);
  }
  if ((undefined1  [96])((undefined1  [96])*decl & (undefined1  [96])0x4) == (undefined1  [96])0x0)
  {
    return;
  }
  fprintf((FILE *)f,", asm=%s",(decl->u).asm_str);
  return;
}

Assistant:

static void print_decl (c2m_ctx_t c2m_ctx, FILE *f, decl_t decl) {
  if (decl == NULL) return;
  fprintf (f, ": ");
  if (decl->scope != NULL) fprintf (f, "scope node = %u, ", decl->scope->uid);
  print_decl_spec (c2m_ctx, f, &decl->decl_spec);
  if (decl->addr_p) fprintf (f, ", addressable");
  if (decl->used_p) fprintf (f, ", used");
  if (decl->reg_p)
    fprintf (f, ", reg");
  else {
    fprintf (f, ", offset = %llu", (unsigned long long) decl->offset);
    if (decl->bit_offset >= 0) fprintf (f, ", bit offset = %d", decl->bit_offset);
  }
  if (decl->asm_p) fprintf (f, ", asm=%s", decl->u.asm_str);
}